

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn ubxGetConfig(int fdPort,int verbosity,ubxConfig *config)

{
  ubxMsg pollMsg;
  ubxMsg pollMsg_00;
  ubxMsg pollMsg_01;
  ubxMsg pollMsg_02;
  ubxMsg pollMsg_03;
  ubxMsg pollMsg_04;
  ubxMsg pollMsg_05;
  errInfo error;
  _Bool _Var1;
  byte bVar2;
  int8_t iVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  int16_t iVar6;
  int32_t iVar7;
  uint32_t uVar8;
  slBuffer *psVar9;
  slReturn pvVar10;
  ubxGNSSConfig *puVar11;
  byte *pbVar12;
  uint64_t uVar13;
  void *pvVar14;
  int i;
  long lVar15;
  int verbosity_00;
  char *msg;
  size_t offset;
  long lVar16;
  ulong uVar17;
  ubxMsg local_1d0;
  ubxMsg nmeaMsg;
  ubxMsg pmsMsg;
  ubxMsg rateMsg;
  ubxMsg tp5Msg;
  ubxMsg nav5Msg;
  ubxMsg gnssMsg;
  ubxMsg antMsg;
  errorInfo_slReturn local_110;
  errorInfo_slReturn local_f0;
  errorInfo_slReturn local_d0;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  psVar9 = create_slBuffer(0,LittleEndian);
  createUbxMsg(&local_1d0,(ubxType)0x1306,psVar9);
  pollMsg.body = local_1d0.body;
  pollMsg.type = local_1d0.type;
  pollMsg._2_6_ = local_1d0._2_6_;
  pollMsg.checksum = local_1d0.checksum;
  pollMsg._18_6_ = local_1d0._18_6_;
  pvVar10 = pollUbx(fdPort,pollMsg,1000,&antMsg);
  _Var1 = isErrorReturn(pvVar10);
  if (_Var1) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxGetConfig",0x3e4,pvVar10);
    msg = "problem getting antenna information from GPS";
  }
  else {
    uVar5 = get_uint16_slBuffer(antMsg.body,0);
    free(psVar9);
    free(antMsg.body);
    uVar17 = (ulong)uVar5;
    _Var1 = isBitSet_slBits(uVar17,0);
    config->antPwr = _Var1;
    _Var1 = isBitSet_slBits(uVar17,1);
    config->antShrtDet = _Var1;
    _Var1 = isBitSet_slBits(uVar17,2);
    config->antOpenDet = _Var1;
    _Var1 = isBitSet_slBits(uVar17,3);
    config->antPwrDwnOnShrt = _Var1;
    _Var1 = isBitSet_slBits(uVar17,4);
    config->antAutoRec = _Var1;
    psVar9 = create_slBuffer(0,LittleEndian);
    createUbxMsg(&local_1d0,(ubxType)0x3e06,psVar9);
    pollMsg_00.body = local_1d0.body;
    pollMsg_00.type = local_1d0.type;
    pollMsg_00._2_6_ = local_1d0._2_6_;
    pollMsg_00.checksum = local_1d0.checksum;
    pollMsg_00._18_6_ = local_1d0._18_6_;
    pvVar10 = pollUbx(fdPort,pollMsg_00,1000,&gnssMsg);
    _Var1 = isErrorReturn(pvVar10);
    if (_Var1) {
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                      ,"ubxGetConfig",0x3f5,pvVar10);
      msg = "problem getting GNSS information from GPS";
      local_50.cause = local_70.cause;
      local_50.fileName = local_70.fileName;
      local_50.functionName = local_70.functionName;
      local_50._24_8_ = local_70._24_8_;
    }
    else {
      bVar2 = get_uint8_slBuffer(gnssMsg.body,1);
      config->trkChnnls = (uint)bVar2;
      bVar2 = get_uint8_slBuffer(gnssMsg.body,3);
      config->gnssRecs = (uint)bVar2;
      puVar11 = (ubxGNSSConfig *)safeMalloc((ulong)bVar2 * 0x14);
      config->gnss = puVar11;
      offset = 10;
      lVar16 = 0;
      for (lVar15 = 0; lVar15 < config->gnssRecs; lVar15 = lVar15 + 1) {
        bVar2 = get_uint8_slBuffer(gnssMsg.body,offset - 6);
        *(uint *)((long)&config->gnss->id + lVar16) = (uint)bVar2;
        bVar2 = get_uint8_slBuffer(gnssMsg.body,offset - 5);
        *(uint *)((long)&config->gnss->minChnnls + lVar16) = (uint)bVar2;
        bVar2 = get_uint8_slBuffer(gnssMsg.body,offset - 4);
        *(uint *)((long)&config->gnss->maxChnnls + lVar16) = (uint)bVar2;
        bVar2 = get_uint8_slBuffer(gnssMsg.body,offset - 2);
        (&config->gnss->enabled)[lVar16] = (_Bool)(bVar2 & 1);
        bVar2 = get_uint8_slBuffer(gnssMsg.body,offset);
        *(uint *)((long)&config->gnss->sigConfig + lVar16) = (uint)bVar2;
        lVar16 = lVar16 + 0x14;
        offset = offset + 8;
      }
      free(psVar9);
      free(gnssMsg.body);
      psVar9 = create_slBuffer(0,LittleEndian);
      createUbxMsg(&local_1d0,(ubxType)0x2406,psVar9);
      pollMsg_01.body = local_1d0.body;
      pollMsg_01.type = local_1d0.type;
      pollMsg_01._2_6_ = local_1d0._2_6_;
      pollMsg_01.checksum = local_1d0.checksum;
      pollMsg_01._18_6_ = local_1d0._18_6_;
      pvVar10 = pollUbx(fdPort,pollMsg_01,2000,&nav5Msg);
      _Var1 = isErrorReturn(pvVar10);
      if (_Var1) {
        createErrorInfo(&local_90,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"ubxGetConfig",0x40a,pvVar10);
        msg = "problem getting navigation engine information from GPS";
        local_50.cause = local_90.cause;
        local_50.fileName = local_90.fileName;
        local_50.functionName = local_90.functionName;
        local_50._24_8_ = local_90._24_8_;
      }
      else {
        bVar2 = get_uint8_slBuffer(nav5Msg.body,2);
        config->model = (uint)bVar2;
        bVar2 = get_uint8_slBuffer(nav5Msg.body,3);
        config->mode = (uint)bVar2;
        iVar7 = get_int32_slBuffer(nav5Msg.body,4);
        config->fixedAltM = (double)iVar7 * 0.01;
        iVar7 = get_int32_slBuffer(nav5Msg.body,8);
        config->fixedAltVarM2 = (double)iVar7 * 0.0001;
        iVar3 = get_int8_slBuffer(nav5Msg.body,0xc);
        config->minElevDeg = (int)iVar3;
        uVar5 = get_uint16_slBuffer(nav5Msg.body,0xe);
        config->pDoP = (double)uVar5 * 0.1;
        uVar5 = get_uint16_slBuffer(nav5Msg.body,0x10);
        config->tDoP = (double)uVar5 * 0.1;
        uVar5 = get_uint16_slBuffer(nav5Msg.body,0x12);
        config->pAccM = uVar5;
        uVar5 = get_uint16_slBuffer(nav5Msg.body,0x14);
        config->tAccM = uVar5;
        uVar4 = get_uint8_slBuffer(nav5Msg.body,0x16);
        config->staticHoldThreshCmS = uVar4;
        uVar4 = get_uint8_slBuffer(nav5Msg.body,0x17);
        config->dgnssTimeoutS = uVar4;
        uVar4 = get_uint8_slBuffer(nav5Msg.body,0x18);
        config->cnoThreshNumSVs = uVar4;
        uVar4 = get_uint8_slBuffer(nav5Msg.body,0x19);
        config->cnoThreshDbHz = uVar4;
        uVar5 = get_uint16_slBuffer(nav5Msg.body,0x1c);
        config->staticHoldMaxDistM = uVar5;
        bVar2 = get_uint8_slBuffer(nav5Msg.body,0x1e);
        config->utcStandard = (uint)bVar2;
        free(psVar9);
        free(nav5Msg.body);
        psVar9 = create_slBuffer(1,LittleEndian);
        pbVar12 = buffer_slBuffer(psVar9);
        *pbVar12 = '\0';
        createUbxMsg(&local_1d0,(ubxType)0x3106,psVar9);
        pollMsg_02.body = local_1d0.body;
        pollMsg_02.type = local_1d0.type;
        pollMsg_02._2_6_ = local_1d0._2_6_;
        pollMsg_02.checksum = local_1d0.checksum;
        pollMsg_02._18_6_ = local_1d0._18_6_;
        pvVar10 = pollUbx(fdPort,pollMsg_02,1000,&tp5Msg);
        _Var1 = isErrorReturn(pvVar10);
        if (_Var1) {
          createErrorInfo(&local_b0,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                          ,"ubxGetConfig",0x425,pvVar10);
          msg = "problem getting time pulse information from GPS";
          local_50.cause = local_b0.cause;
          local_50.fileName = local_b0.fileName;
          local_50.functionName = local_b0.functionName;
          local_50._24_8_ = local_b0._24_8_;
        }
        else {
          iVar6 = get_int16_slBuffer(tp5Msg.body,4);
          config->antCableDelayNs = iVar6;
          iVar6 = get_int16_slBuffer(tp5Msg.body,6);
          config->rfGroupDelayNs = iVar6;
          uVar8 = get_uint32_slBuffer(tp5Msg.body,8);
          config->freqPeriod = uVar8;
          uVar8 = get_uint32_slBuffer(tp5Msg.body,0xc);
          config->freqPeriodLock = uVar8;
          uVar8 = get_uint32_slBuffer(tp5Msg.body,0x10);
          config->pulseLenRatio = uVar8;
          uVar8 = get_uint32_slBuffer(tp5Msg.body,0x14);
          config->pulseLenRatioLock = uVar8;
          iVar7 = get_int32_slBuffer(tp5Msg.body,0x18);
          config->userConfigDelay = iVar7;
          uVar8 = get_uint32_slBuffer(tp5Msg.body,0x1c);
          uVar17 = (ulong)uVar8;
          _Var1 = isBitSet_slBits(uVar17,0);
          config->timePulse0Enabled = _Var1;
          _Var1 = isBitSet_slBits(uVar17,1);
          config->lockGpsFreq = _Var1;
          _Var1 = isBitSet_slBits(uVar17,2);
          config->lockedOtherSet = _Var1;
          _Var1 = isBitSet_slBits(uVar17,3);
          config->isFreq = _Var1;
          _Var1 = isBitSet_slBits(uVar17,4);
          config->isLength = _Var1;
          _Var1 = isBitSet_slBits(uVar17,5);
          config->alignToTow = _Var1;
          _Var1 = isBitSet_slBits(uVar17,6);
          config->polarity = _Var1;
          uVar13 = getBitField_slBits(uVar17,0x780);
          config->gridUtcTnss = (timegridType)uVar13;
          free(psVar9);
          free(tp5Msg.body);
          psVar9 = create_slBuffer(0,LittleEndian);
          createUbxMsg(&local_1d0,(ubxType)0x806,psVar9);
          pollMsg_03.body = local_1d0.body;
          pollMsg_03.type = local_1d0.type;
          pollMsg_03._2_6_ = local_1d0._2_6_;
          pollMsg_03.checksum = local_1d0.checksum;
          pollMsg_03._18_6_ = local_1d0._18_6_;
          pvVar10 = pollUbx(fdPort,pollMsg_03,1000,&rateMsg);
          _Var1 = isErrorReturn(pvVar10);
          if (_Var1) {
            createErrorInfo(&local_d0,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                            ,"ubxGetConfig",0x440,pvVar10);
            msg = "problem getting fix rate information from GPS";
            local_50.cause = local_d0.cause;
            local_50.fileName = local_d0.fileName;
            local_50.functionName = local_d0.functionName;
            local_50._24_8_ = local_d0._24_8_;
          }
          else {
            uVar5 = get_uint16_slBuffer(rateMsg.body,0);
            config->measRateMs = uVar5;
            uVar5 = get_uint16_slBuffer(rateMsg.body,2);
            config->navRate = uVar5;
            uVar5 = get_uint16_slBuffer(rateMsg.body,4);
            config->timeRef = (uint)uVar5;
            free(psVar9);
            free(rateMsg.body);
            psVar9 = create_slBuffer(0,LittleEndian);
            createUbxMsg(&local_1d0,(ubxType)0x8606,psVar9);
            pollMsg_04.body = local_1d0.body;
            pollMsg_04.type = local_1d0.type;
            pollMsg_04._2_6_ = local_1d0._2_6_;
            pollMsg_04.checksum = local_1d0.checksum;
            pollMsg_04._18_6_ = local_1d0._18_6_;
            pvVar10 = pollUbx(fdPort,pollMsg_04,1000,&pmsMsg);
            _Var1 = isErrorReturn(pvVar10);
            if (_Var1) {
              createErrorInfo(&local_f0,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"ubxGetConfig",0x44e,pvVar10);
              msg = "problem getting power mode information from GPS";
              local_50.cause = local_f0.cause;
              local_50.fileName = local_f0.fileName;
              local_50.functionName = local_f0.functionName;
              local_50._24_8_ = local_f0._24_8_;
            }
            else {
              bVar2 = get_uint8_slBuffer(pmsMsg.body,1);
              config->powerSetup = (uint)bVar2;
              uVar5 = get_uint16_slBuffer(pmsMsg.body,2);
              config->powerIntervalSecs = uVar5;
              uVar5 = get_uint16_slBuffer(pmsMsg.body,4);
              config->powerOnTimeSecs = uVar5;
              free(psVar9);
              free(pmsMsg.body);
              pvVar10 = isNmeaOn(fdPort);
              _Var1 = isErrorReturn(pvVar10);
              if (_Var1) {
                return pvVar10;
              }
              pvVar14 = getReturnInfo(pvVar10);
              config->nmeaEnabled = pvVar14 != (void *)0x0;
              psVar9 = create_slBuffer(0,LittleEndian);
              createUbxMsg(&local_1d0,(ubxType)0x1706,psVar9);
              pollMsg_05.body = local_1d0.body;
              pollMsg_05.type = local_1d0.type;
              pollMsg_05._2_6_ = local_1d0._2_6_;
              pollMsg_05.checksum = local_1d0.checksum;
              pollMsg_05._18_6_ = local_1d0._18_6_;
              pvVar10 = pollUbx(fdPort,pollMsg_05,1000,&nmeaMsg);
              _Var1 = isErrorReturn(pvVar10);
              if (!_Var1) {
                verbosity_00 = 1;
                uVar4 = get_uint8_slBuffer(nmeaMsg.body,1);
                config->nmeaVersion = uVar4;
                free(psVar9);
                free(nmeaMsg.body);
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GGA);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GGA = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GLL);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GLL = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GSA);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GSA = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GSV);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GSV = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,RMC);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->RMC = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,VTG);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->VTG = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GRS);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GRS = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,GST);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->GST = pvVar14 != (void *)0x0;
                pvVar10 = isNMEAmsgEnabled(fdPort,verbosity_00,ZDA);
                _Var1 = isErrorReturn(pvVar10);
                if (_Var1) {
                  return pvVar10;
                }
                pvVar14 = getReturnInfo(pvVar10);
                config->ZDA = pvVar14 != (void *)0x0;
                pvVar10 = makeOkReturn();
                return pvVar10;
              }
              createErrorInfo(&local_110,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"ubxGetConfig",0x462,pvVar10);
              msg = "problem getting NMEA Version information from GPS";
              local_50.cause = local_110.cause;
              local_50.fileName = local_110.fileName;
              local_50.functionName = local_110.functionName;
              local_50._24_8_ = local_110._24_8_;
            }
          }
        }
      }
    }
  }
  error.fileName = local_50.fileName;
  error.cause = local_50.cause;
  error.functionName = local_50.functionName;
  error.lineNumber = local_50.lineNumber;
  error._28_4_ = local_50._28_4_;
  pvVar10 = makeErrorMsgReturn(error,msg);
  return pvVar10;
}

Assistant:

extern slReturn ubxGetConfig(int fdPort, int verbosity, ubxConfig* config) {

    // get the antenna configuration...
    ubxType antType = { UBX_CFG, UBX_CFG_ANT };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(antType, body);
    ubxMsg antMsg;
    slReturn antResp = pollUbx(fdPort, msg, CFG_ANT_MAX_MS, &antMsg);
    if (isErrorReturn(antResp))
        return makeErrorMsgReturn(ERR_CAUSE(antResp), "problem getting antenna information from GPS");
    uint16_t antMask = get_uint16_slBuffer(antMsg.body, 0);
    free(body);
    free(antMsg.body);
    config->antPwr          = isBitSet_slBits(antMask, 0);
    config->antShrtDet      = isBitSet_slBits(antMask, 1);
    config->antOpenDet      = isBitSet_slBits(antMask, 2);
    config->antPwrDwnOnShrt = isBitSet_slBits(antMask, 3);
    config->antAutoRec      = isBitSet_slBits(antMask, 4);

    // get the GNSS configuration...
    ubxType gnssType = { UBX_CFG, UBX_CFG_GNSS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(gnssType, body);
    ubxMsg gnssMsg;
    slReturn gnssResp = pollUbx(fdPort, msg, CFG_GNSS_MAX_MS, &gnssMsg);
    if (isErrorReturn(gnssResp))
        return makeErrorMsgReturn(ERR_CAUSE(gnssResp), "problem getting GNSS information from GPS");
    config->trkChnnls = get_uint8_slBuffer(gnssMsg.body, 1);
    config->gnssRecs = get_uint8_slBuffer(gnssMsg.body, 3);  // number of configuration blocks...
    config->gnss = safeMalloc(sizeof(ubxGNSSConfig) * config->gnssRecs);
    for (int i = 0; i < config->gnssRecs; i++) {
        config->gnss[i].id        = (gnssID) get_uint8_slBuffer(gnssMsg.body,  4 + 8 * (size_t)i);
        config->gnss[i].minChnnls =          get_uint8_slBuffer(gnssMsg.body,  5 + 8 * (size_t)i);
        config->gnss[i].maxChnnls =          get_uint8_slBuffer(gnssMsg.body,  6 + 8 * (size_t)i);
        config->gnss[i].enabled   = (bool)  (get_uint8_slBuffer(gnssMsg.body,  8 + 8 * (size_t)i) & 0x01);
        config->gnss[i].sigConfig =          get_uint8_slBuffer(gnssMsg.body, 10 + 8 * (size_t)i);
    }
    free(body);
    free(gnssMsg.body);

    // get the navigation engine configuration...
    ubxType nav5Type = { UBX_CFG, UBX_CFG_NAV5 };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nav5Type, body);
    ubxMsg nav5Msg;
    slReturn nav5Resp = pollUbx(fdPort, msg, CFG_NAV5_MAX_MS, &nav5Msg);
    if (isErrorReturn(nav5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(nav5Resp), "problem getting navigation engine information from GPS");
    config->model               = (dynModel) get_uint8_slBuffer(nav5Msg.body,  2);
    config->mode                = (fixMode)  get_uint8_slBuffer(nav5Msg.body,  3);
    config->fixedAltM           = 0.01 *     get_int32_slBuffer(nav5Msg.body,  4);
    config->fixedAltVarM2       = 0.0001 *   get_int32_slBuffer(nav5Msg.body,  8);
    config->minElevDeg          =            get_int8_slBuffer(nav5Msg.body, 12);
    config->pDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 14);
    config->tDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 16);
    config->pAccM               =            get_uint16_slBuffer(nav5Msg.body, 18);
    config->tAccM               =            get_uint16_slBuffer(nav5Msg.body, 20);
    config->staticHoldThreshCmS =            get_uint8_slBuffer(nav5Msg.body, 22);
    config->dgnssTimeoutS       =            get_uint8_slBuffer(nav5Msg.body, 23);
    config->cnoThreshNumSVs     =            get_uint8_slBuffer(nav5Msg.body, 24);
    config->cnoThreshDbHz       =            get_uint8_slBuffer(nav5Msg.body, 25);
    config->staticHoldMaxDistM  =            get_uint16_slBuffer(nav5Msg.body, 28);
    config->utcStandard         = (utcType)  get_uint8_slBuffer(nav5Msg.body, 30);
    free(body);
    free(nav5Msg.body);

    // get the time pulse configuration...
    ubxType tp5Type = { UBX_CFG, UBX_CFG_TP5 };
    body = create_slBuffer(1, LittleEndian);
    *buffer_slBuffer(body) = 0;  // we only look at time pulse zero...
    msg = createUbxMsg(tp5Type, body);
    ubxMsg tp5Msg;
    slReturn tp5Resp = pollUbx(fdPort, msg, CFG_TP5_MAX_MS, &tp5Msg);
    if (isErrorReturn(tp5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(tp5Resp), "problem getting time pulse information from GPS");
    config->antCableDelayNs   = get_int16_slBuffer(tp5Msg.body,  4);
    config->rfGroupDelayNs    = get_int16_slBuffer(tp5Msg.body,  6);
    config->freqPeriod        = get_uint32_slBuffer(tp5Msg.body,  8);
    config->freqPeriodLock    = get_uint32_slBuffer(tp5Msg.body, 12);
    config->pulseLenRatio     = get_uint32_slBuffer(tp5Msg.body, 16);
    config->pulseLenRatioLock = get_uint32_slBuffer(tp5Msg.body, 20);
    config->userConfigDelay   = get_int32_slBuffer(tp5Msg.body, 24);
    uint32_t flags            = get_uint32_slBuffer(tp5Msg.body, 28);
    config->timePulse0Enabled = isBitSet_slBits(flags, 0);
    config->lockGpsFreq      = isBitSet_slBits(flags, 1);
    config->lockedOtherSet    = isBitSet_slBits(flags, 2);
    config->isFreq            = isBitSet_slBits(flags, 3);
    config->isLength          = isBitSet_slBits(flags, 4);
    config->alignToTow        = isBitSet_slBits(flags, 5);
    config->polarity          = isBitSet_slBits(flags, 6);
    config->gridUtcTnss       = (timegridType) getBitField_slBits(flags, 0x000000780);
    free(body);
    free(tp5Msg.body);

    // get the fix rate configuration...
    ubxType rateType = { UBX_CFG, UBX_CFG_RATE };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(rateType, body);
    ubxMsg rateMsg;
    slReturn rateResp = pollUbx(fdPort, msg, CFG_RATE_MAX_MS, &rateMsg);
    if (isErrorReturn(rateResp))
        return makeErrorMsgReturn(ERR_CAUSE(rateResp), "problem getting fix rate information from GPS");
    config->measRateMs =                  get_uint16_slBuffer(rateMsg.body, 0);
    config->navRate    =                  get_uint16_slBuffer(rateMsg.body, 2);
    config->timeRef    = (fixTimeRefType) get_uint16_slBuffer(rateMsg.body, 4);
    free(body);
    free(rateMsg.body);

    // get the power mode configuration...
    ubxType pmsType = { UBX_CFG, UBX_CFG_PMS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(pmsType, body);
    ubxMsg pmsMsg;
    slReturn pmsResp = pollUbx(fdPort, msg, CFG_PMS_MAX_MS, &pmsMsg);
    if (isErrorReturn(pmsResp))
        return makeErrorMsgReturn(ERR_CAUSE(pmsResp), "problem getting power mode information from GPS");
    config->powerSetup        = (powerModeType) get_uint8_slBuffer(pmsMsg.body, 1);
    config->powerIntervalSecs =                 get_uint16_slBuffer(pmsMsg.body, 2);
    config->powerOnTimeSecs   =                 get_uint16_slBuffer(pmsMsg.body, 4);
    free(body);
    free(pmsMsg.body);

    // get the NMEA configuration...
    // is NMEA enabled?
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;
    config->nmeaEnabled = getReturnInfoBool(cn);

    // get NMEA Version
    ubxType nmeaType = { UBX_CFG, UBX_CFG_NMEA };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nmeaType, body);
    ubxMsg nmeaMsg;
    slReturn nmeaResp = pollUbx(fdPort, msg, CFG_NMEA_MAX_MS, &nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "problem getting NMEA Version information from GPS");
    config->nmeaVersion        = get_uint8_slBuffer(nmeaMsg.body, 1);
    free(body);
    free(nmeaMsg.body);

    // Get NMEA sentence config
    cn = isNMEAmsgEnabled(fdPort, verbosity, GGA);
    if (isErrorReturn(cn)) return cn;
    config->GGA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GLL);
    if (isErrorReturn(cn)) return cn;
    config->GLL = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSA);
    if (isErrorReturn(cn)) return cn;
    config->GSA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSV);
    if (isErrorReturn(cn)) return cn;
    config->GSV = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, RMC);
    if (isErrorReturn(cn)) return cn;
    config->RMC = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, VTG);
    if (isErrorReturn(cn)) return cn;
    config->VTG = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GRS);
    if (isErrorReturn(cn)) return cn;
    config->GRS = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GST);
    if (isErrorReturn(cn)) return cn;
    config->GST = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, ZDA);
    if (isErrorReturn(cn)) return cn;
    config->ZDA = getReturnInfoBool(cn);

    return makeOkReturn();
}